

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

NamespaceAliasDeclaration * __thiscall
soul::ResolutionPass::NamespaceAliasResolver::visit
          (NamespaceAliasResolver *this,NamespaceAliasDeclaration *instance)

{
  pool_ptr<soul::AST::Expression> *e;
  size_t *psVar1;
  Expression *pEVar2;
  bool bVar3;
  Namespace *pNVar4;
  pool_ptr<soul::AST::Namespace> target;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> specialisationArgs;
  Namespace *local_130;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> local_128;
  pool_ptr<soul::AST::Expression> local_f0;
  IdentifierPath local_e8;
  CompileMessage local_90;
  CompileMessage local_58;
  
  e = &instance->targetNamespace;
  RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,e);
  RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,&instance->specialisationArgs);
  if ((instance->resolvedNamespace).object != (Namespace *)0x0) {
    return instance;
  }
  if ((instance->targetNamespace).object == (Expression *)0x0) {
    return instance;
  }
  local_f0.object = (instance->specialisationArgs).object;
  AST::CommaSeparatedList::getAsExpressionList(&local_128,&local_f0);
  if (e->object == (Expression *)0x0) {
    throwInternalCompilerError("object != nullptr","operator->",0x3c);
  }
  (*(e->object->super_Statement).super_ASTObject._vptr_ASTObject[7])(&local_130);
  if (local_130 == (Namespace *)0x0) {
    if ((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.ignoreErrors ==
        false) {
      pEVar2 = e->object;
      if (pEVar2 != (Expression *)0x0) {
        CompileMessageHelpers::createMessage<>(&local_90,syntax,error,"Expected a namespace name");
        AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_90,false)
        ;
      }
      goto LAB_00212c94;
    }
  }
  else {
    bVar3 = ModuleInstanceResolver::validateSpecialisationArgs
                      (&this->super_ModuleInstanceResolver,&local_128,
                       &(local_130->super_ModuleBase).specialisationParams,false);
    if (!bVar3) {
      if (local_130 != (Namespace *)0x0) {
        (*(local_130->super_ModuleBase).super_ASTObject._vptr_ASTObject[0xe])(&local_e8);
        CompileMessageHelpers::createMessage<soul::IdentifierPath>
                  (&local_58,syntax,error,"Wrong number of arguments to instantiate namespace $Q0$",
                   &local_e8);
        AST::Context::throwError(&(instance->super_ASTObject).context,&local_58,false);
      }
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    if (local_130 == (Namespace *)0x0) {
LAB_00212c94:
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    bVar3 = ModuleInstanceResolver::canResolveAllSpecialisationArgs
                      (&this->super_ModuleInstanceResolver,&local_128,
                       &(local_130->super_ModuleBase).specialisationParams);
    if (bVar3) {
      if (local_130 == (Namespace *)0x0) {
        throwInternalCompilerError("object != nullptr","operator*",0x3b);
      }
      pNVar4 = ModuleInstanceResolver::getOrAddNamespaceSpecialisation
                         (&this->super_ModuleInstanceResolver,local_130,&local_128);
      (instance->resolvedNamespace).object = pNVar4;
      psVar1 = &(this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                super_RewritingASTVisitor.itemsReplaced;
      *psVar1 = *psVar1 + 1;
      goto LAB_00212c20;
    }
  }
  psVar1 = &(this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails;
  *psVar1 = *psVar1 + 1;
LAB_00212c20:
  local_128.numActive = 0;
  if ((4 < local_128.numAllocated) && (local_128.items != (pool_ref<soul::AST::Expression> *)0x0)) {
    operator_delete__(local_128.items);
  }
  return instance;
}

Assistant:

AST::NamespaceAliasDeclaration& visit (AST::NamespaceAliasDeclaration& instance) override
        {
            super::visit (instance);

            if (instance.isResolved())
                return instance;

            if (instance.targetNamespace == nullptr)
                return instance;

            auto specialisationArgs = AST::CommaSeparatedList::getAsExpressionList (instance.specialisationArgs);

            if (auto target = instance.targetNamespace->getAsNamespace())
            {
                if (! validateSpecialisationArgs (specialisationArgs, target->specialisationParams, false))
                    instance.context.throwError (Errors::wrongNumArgsForNamespace (target->getFullyQualifiedDisplayPath()));

                if (canResolveAllSpecialisationArgs (specialisationArgs, target->specialisationParams))
                {
                    instance.resolvedNamespace = getOrAddNamespaceSpecialisation (*target, specialisationArgs);
                    ++itemsReplaced;
                    return instance;
                }
            }
            else
            {
                if (! ignoreErrors)
                    instance.targetNamespace->context.throwError (Errors::expectedNamespaceName());
            }

            ++numFails;
            return instance;
        }